

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> * __thiscall
rangeless::fn::impl::sort_by<rangeless::fn::by::identity,rangeless::fn::impl::unstable_sort_tag>::
operator()(vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>
           *__return_storage_ptr__,
          sort_by<rangeless::fn::by::identity,rangeless::fn::impl::unstable_sort_tag> *this,
          vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> *src)

{
  vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> *src_local;
  sort_by<rangeless::fn::by::identity,_rangeless::fn::impl::unstable_sort_tag> *this_local;
  
  require_iterator_category_at_least<std::random_access_iterator_tag,std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>
            (src);
  operator()(src,this);
  std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::vector
            (__return_storage_ptr__,src);
  return __return_storage_ptr__;
}

Assistant:

Iterable operator()(Iterable src) const
        {
            impl::require_iterator_category_at_least<std::random_access_iterator_tag>(src);

            // this will fire if Iterable is std::map, where value_type is std::pair<const Key, Value>,
            // which is not move-assignable because of constness.
            static_assert(std::is_move_assignable<typename Iterable::value_type>::value, "value_type must be move-assignable.");

            s_sort( src, 
                    [this](const typename Iterable::value_type& x, 
                           const typename Iterable::value_type& y)
                    {
                        return lt{}(key_fn(x), key_fn(y));
                    }
                    , SortTag{});

            return src;
        }